

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btConvexHullComputer.cpp
# Opt level: O0

int __thiscall btConvexHullInternal::Face::init(Face *this,EVP_PKEY_CTX *ctx)

{
  undefined8 uVar1;
  Point32 PVar2;
  Vertex *in_stack_ffffffffffffffc0;
  uint64_t local_38;
  uint64_t local_30;
  uint64_t local_28;
  
  this->nearbyVertex = (Vertex *)ctx;
  uVar1 = *(undefined8 *)(ctx + 0x68);
  (this->origin).x = (int)uVar1;
  (this->origin).y = (int)((ulong)uVar1 >> 0x20);
  uVar1 = *(undefined8 *)(ctx + 0x70);
  (this->origin).z = (int)uVar1;
  (this->origin).index = (int)((ulong)uVar1 >> 0x20);
  PVar2 = Vertex::operator-(in_stack_ffffffffffffffc0,(Vertex *)this);
  local_30 = PVar2._0_8_;
  (((Vertex *)this)->point128).x.low = local_30;
  local_28 = PVar2._8_8_;
  (((Vertex *)this)->point128).x.high = local_28;
  PVar2 = Vertex::operator-(in_stack_ffffffffffffffc0,(Vertex *)this);
  (((Vertex *)this)->point128).y.low = PVar2._0_8_;
  local_38 = PVar2._8_8_;
  (((Vertex *)this)->point128).y.high = local_38;
  if (*(long *)(ctx + 0x20) == 0) {
    *(Face **)(ctx + 0x18) = this;
  }
  else {
    *(Face **)(*(long *)(ctx + 0x20) + 0x10) = this;
  }
  *(Face **)(ctx + 0x20) = this;
  return (int)ctx;
}

Assistant:

void init(Vertex* a, Vertex* b, Vertex* c)
				{
					nearbyVertex = a;
					origin = a->point;
					dir0 = *b - *a;
					dir1 = *c - *a;
					if (a->lastNearbyFace)
					{
						a->lastNearbyFace->nextWithSameNearbyVertex = this;
					}
					else
					{
						a->firstNearbyFace = this;
					}
					a->lastNearbyFace = this;
				}